

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitTupleExtract(OptimizeInstructions *this,TupleExtract *curr)

{
  Type type;
  bool bVar1;
  Index index;
  TupleMake *curr_00;
  Module *wasm;
  Type *pTVar2;
  Function *func;
  Expression **ppEVar3;
  LocalSet *pLVar4;
  LocalGet *result;
  Expression *rep;
  LocalGet *get;
  Index tempLocal;
  Type valueType;
  Builder builder;
  TupleMake *make;
  TupleExtract *local_18;
  TupleExtract *curr_local;
  OptimizeInstructions *this_local;
  
  make._4_4_ = 1;
  local_18 = curr;
  curr_local = (TupleExtract *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                      type,(BasicType *)((long)&make + 4));
  if ((!bVar1) &&
     (curr_00 = Expression::dynCast<wasm::TupleMake>(local_18->tuple), curr_00 != (TupleMake *)0x0))
  {
    wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
    Builder::Builder((Builder *)&valueType,wasm);
    pTVar2 = wasm::Type::operator[]
                       (&(curr_00->super_SpecificExpression<(wasm::Expression::Id)57>).
                         super_Expression.type,(ulong)local_18->index);
    type.id = pTVar2->id;
    func = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    index = Builder::addVar(func,type);
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr_00->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)local_18->index);
    pLVar4 = Builder::makeLocalTee((Builder *)&valueType,index,*ppEVar3,type);
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr_00->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)local_18->index);
    *ppEVar3 = (Expression *)pLVar4;
    result = Builder::makeLocalGet((Builder *)&valueType,index,type);
    rep = getDroppedChildrenAndAppend(this,(Expression *)curr_00,(Expression *)result);
    replaceCurrent(this,rep);
  }
  return;
}

Assistant:

void visitTupleExtract(TupleExtract* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    if (auto* make = curr->tuple->dynCast<TupleMake>()) {
      Builder builder(*getModule());

      // Store the value of the lane we want in a tee, and return that after a
      // drop of the tuple (which might have side effects).
      auto valueType = make->type[curr->index];
      Index tempLocal = builder.addVar(getFunction(), valueType);
      make->operands[curr->index] =
        builder.makeLocalTee(tempLocal, make->operands[curr->index], valueType);
      auto* get = builder.makeLocalGet(tempLocal, valueType);
      replaceCurrent(getDroppedChildrenAndAppend(make, get));
    }
  }